

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O2

string * __thiscall
choc::text::CodePrinter::toString_abi_cxx11_(string *__return_storage_ptr__,CodePrinter *this)

{
  pointer pLVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  size_t sVar2;
  Line *l;
  pointer pLVar3;
  string *s;
  const_iterator __end2;
  vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_> *__range2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pLVar1 = (this->lines).
           super__Vector_base<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pLVar3 = (this->lines).
                super__Vector_base<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
                ._M_impl.super__Vector_impl_data._M_start; pLVar3 != pLVar1; pLVar3 = pLVar3 + 1) {
    getLengthWithTrimmedEnd(&pLVar3->line);
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pLVar3 = (this->lines).
           super__Vector_base<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (this->lines).
           super__Vector_base<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while (s = (string *)((long)pLVar3 + 8), pLVar3 = (pointer)((long)&s[-1].field_2 + 8),
        pLVar3 != pLVar1) {
    sVar2 = getLengthWithTrimmedEnd(s);
    if (sVar2 != 0) {
      std::__cxx11::string::append((ulong)__return_storage_ptr__,(char)pLVar3->indent);
      __first._M_current = (s->_M_dataplus)._M_p;
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)__return_storage_ptr__,__first,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(__first._M_current + sVar2));
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    pLVar3 = (pointer)(s + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string CodePrinter::toString() const
{
    std::string s;
    auto totalLen = lines.size() * newLineString.length() + 1;

    for (auto& l : lines)
        if (auto contentLen = getLengthWithTrimmedEnd (l.line))
            totalLen += l.indent + contentLen;

    s.reserve (totalLen);

    for (auto& l : lines)
    {
        if (auto contentLen = getLengthWithTrimmedEnd (l.line))
        {
            s.append (l.indent, ' ');
            s.append (l.line.begin(), l.line.begin() + static_cast<std::string::difference_type> (contentLen));
        }

        s.append (newLineString);
    }

    return s;
}